

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  bool local_26d;
  int local_26c;
  uchar local_268 [4];
  int overflow;
  uchar buf [32];
  secp256k1_ge r;
  secp256k1_fe rx;
  secp256k1_gej pkj;
  secp256k1_ge pk;
  secp256k1_gej rj;
  secp256k1_scalar e;
  secp256k1_scalar s;
  secp256k1_xonly_pubkey *pubkey_local;
  uchar *msg32_local;
  uchar *sig64_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)");
    ctx_local._4_4_ = 0;
  }
  else if (sig64 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig64 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)&r.infinity,sig64);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_scalar_set_b32((secp256k1_scalar *)(e.d + 3),sig64 + 0x20,&local_26c);
      if (local_26c == 0) {
        iVar1 = secp256k1_xonly_pubkey_load(ctx,(secp256k1_ge *)&pkj.infinity,pubkey);
        if (iVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          secp256k1_fe_get_b32(local_268,(secp256k1_fe *)&pkj.infinity);
          secp256k1_schnorrsig_challenge((secp256k1_scalar *)&rj.infinity,sig64,msg32,local_268);
          secp256k1_scalar_negate((secp256k1_scalar *)&rj.infinity,(secp256k1_scalar *)&rj.infinity)
          ;
          secp256k1_gej_set_ge((secp256k1_gej *)(rx.n + 4),(secp256k1_ge *)&pkj.infinity);
          secp256k1_ecmult(&ctx->ecmult_ctx,(secp256k1_gej *)&pk.infinity,
                           (secp256k1_gej *)(rx.n + 4),(secp256k1_scalar *)&rj.infinity,
                           (secp256k1_scalar *)(e.d + 3));
          secp256k1_ge_set_gej_var((secp256k1_ge *)(buf + 0x18),(secp256k1_gej *)&pk.infinity);
          iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)(buf + 0x18));
          if (iVar1 == 0) {
            secp256k1_fe_normalize_var((secp256k1_fe *)(r.x.n + 4));
            iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)(r.x.n + 4));
            local_26d = false;
            if (iVar1 == 0) {
              iVar1 = secp256k1_fe_equal_var
                                ((secp256k1_fe *)&r.infinity,(secp256k1_fe *)(buf + 0x18));
              local_26d = iVar1 != 0;
            }
            ctx_local._4_4_ = (uint)local_26d;
          }
          else {
            ctx_local._4_4_ = 0;
          }
        }
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg32, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg32, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&ctx->ecmult_ctx, &rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal_var(&rx, &r.x);
}